

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O0

string * hashStr2(string *__return_storage_ptr__,string *param_1,uint16_t seed,size_t n1,size_t n2,
                 string *default_value,string *map_name,string *key_type,bool nonKeyLookups)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_3a;
  byte local_39;
  string *psStack_38;
  bool nonKeyLookups_local;
  string *default_value_local;
  size_t n2_local;
  size_t n1_local;
  string *psStack_18;
  uint16_t seed_local;
  string *param_0_local;
  string *hash;
  
  local_39 = nonKeyLookups;
  local_3a = 0;
  psStack_38 = default_value;
  default_value_local = (string *)n2;
  n2_local = n1;
  n1_local._6_2_ = seed;
  psStack_18 = param_1;
  param_0_local = __return_storage_ptr__;
  std::operator+(&local_160,
                 "    static inline uint32_t hash(const std::string& key, const uint32_t& coeff) noexcept{\n        uint32_t h = 0;\n\n        for(size_t i = 0; i < key.size(); i++)\n            h = h*coeff + key[i];\n\n        return h;\n    }\n};\n\nstd::string_view "
                 ,map_name);
  std::operator+(&local_140,&local_160,"::lookup(const ");
  std::operator+(&local_120,&local_140,key_type);
  std::operator+(&local_100,&local_120,"& key) noexcept{\n    constexpr uint32_t s0 = ");
  std::__cxx11::to_string(&local_190,(uint)n1_local._6_2_);
  std::operator+(&local_e0,&local_100,&local_190);
  std::operator+(&local_c0,&local_e0,";\n    const size_t h1 = hash(key, s0) & ");
  std::__cxx11::to_string(&local_1b0,n2_local);
  std::operator+(&local_a0,&local_c0,&local_1b0);
  std::operator+(&local_80,&local_a0,
                 ";\n    const uint32_t& s1 = seeds[h1];\n    const size_t bin = hash(key, s1) & ");
  std::__cxx11::to_string(&local_1d0,(unsigned_long)default_value_local);
  std::operator+(&local_60,&local_80,&local_1d0);
  std::operator+(__return_storage_ptr__,&local_60,";\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  if ((local_39 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "    #ifndef NDEBUG\n    assert(checkBin(key, bin));\n    #endif\n\n    return std::string_view(&flat_vals[val_start[bin]], val_size[bin]);\n"
              );
  }
  else {
    std::operator+(&local_210,
                   "    return checkBin(key, bin) ? std::string_view(&flat_vals[val_start[bin]], val_size[bin]) : \""
                   ,psStack_38);
    std::operator+(&local_1f0,&local_210,"\";\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}\n\n");
  return __return_storage_ptr__;
}

Assistant:

std::string hashStr2(const std::string&, uint16_t seed, size_t n1, size_t n2, const std::string& default_value, std::string map_name, std::string key_type, bool nonKeyLookups){
    std::string hash =
        "    static inline uint32_t hash(const std::string& key, const uint32_t& coeff) noexcept{\n"
        "        uint32_t h = 0;\n"
        "\n"
        "        for(size_t i = 0; i < key.size(); i++)\n"
        "            h = h*coeff + key[i];\n"
        "\n"
        "        return h;\n"
        "    }\n"
        "};\n"
        "\n"
        "std::string_view " + map_name + "::lookup(const " + key_type + "& key) noexcept{\n"
        "    constexpr uint32_t s0 = " + std::to_string(seed) + ";\n"
        "    const size_t h1 = hash(key, s0) & " + std::to_string(n1) + ";\n"
        "    const uint32_t& s1 = seeds[h1];\n"
        "    const size_t bin = hash(key, s1) & " + std::to_string(n2) + ";\n";
    if(nonKeyLookups) hash +=
        "    return checkBin(key, bin) ? std::string_view(&flat_vals[val_start[bin]], val_size[bin]) : \"" + default_value + "\";\n";
    else hash +=
        "    #ifndef NDEBUG\n"
        "    assert(checkBin(key, bin));\n"
        "    #endif\n\n"
        "    return std::string_view(&flat_vals[val_start[bin]], val_size[bin]);\n";

    hash += "}\n\n";

    return hash;
}